

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O1

void __thiscall HashSet<String>::HashSet(HashSet<String> *this,HashSet<String> *other)

{
  Item *key;
  
  (this->_end).item = &this->endItem;
  (this->_begin).item = &this->endItem;
  this->_size = 0;
  this->capacity = 500;
  this->data = (Item **)0x0;
  (this->endItem).key.data = &String::emptyData.super_Data;
  (this->endItem).prev = (Item *)0x0;
  (this->endItem).next = (Item *)0x0;
  this->freeItem = (Item *)0x0;
  this->blocks = (ItemBlock *)0x0;
  for (key = (other->_begin).item; key != &other->endItem; key = key->next) {
    insert(this,&this->_end,&key->key);
  }
  return;
}

Assistant:

HashSet(const HashSet& other) : _end(&endItem), _begin(&endItem), _size(0), capacity(500), data(0), freeItem(0), blocks(0)
  {
    endItem.prev = 0;
    endItem.next = 0;
    for(const Item* i = other._begin.item, * end = &other.endItem; i != end; i = i->next)
      append(i->key);
  }